

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void cnn::TensorTools::CopyElements(Tensor *v,Tensor *v_src)

{
  void *__src;
  uint uVar1;
  long in_RSI;
  long in_RDI;
  Dim *this;
  
  this = *(Dim **)(in_RDI + 0x28);
  __src = *(void **)(in_RSI + 0x28);
  uVar1 = Dim::size(this);
  memcpy(this,__src,(ulong)uVar1 << 2);
  return;
}

Assistant:

void TensorTools::CopyElements(const Tensor& v, const Tensor& v_src) {
#if HAVE_CUDA
  cudaMemcpyAsync(v.v, v_src.v, sizeof(real) * v.d.size(), cudaMemcpyDeviceToDevice);
#else
  memcpy(v.v, v_src.v, sizeof(real) * v.d.size());
#endif
}